

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.cpp
# Opt level: O1

vector<mjs::value,_std::allocator<mjs::value>_> * __thiscall
mjs::bound_function_args::build_args
          (vector<mjs::value,_std::allocator<mjs::value>_> *__return_storage_ptr__,
          bound_function_args *this,vector<mjs::value,_std::allocator<mjs::value>_> *extra_args)

{
  gc_vector<mjs::value_representation> *this_00;
  gc_table *pgVar1;
  value_representation *this_01;
  uint index;
  value local_58;
  
  if ((this->bound_args_).pos_ == 0) {
    std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(__return_storage_ptr__,extra_args);
  }
  else {
    (__return_storage_ptr__->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::value_representation>,_true>::dereference
                        (&this->bound_args_,this->heap_);
    index = 0;
    while( true ) {
      pgVar1 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::value_representation>::gc_table,_true>::
               dereference(&this_00->table_,this_00->heap_);
      if (pgVar1->length_ <= index) break;
      this_01 = gc_vector<mjs::value_representation>::operator[](this_00,index);
      value_representation::get_value(&local_58,this_01,this->heap_);
      std::vector<mjs::value,_std::allocator<mjs::value>_>::emplace_back<mjs::value>
                (__return_storage_ptr__,&local_58);
      value::destroy(&local_58);
      index = index + 1;
    }
    std::vector<mjs::value,std::allocator<mjs::value>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<mjs::value_const*,std::vector<mjs::value,std::allocator<mjs::value>>>>
              ((vector<mjs::value,std::allocator<mjs::value>> *)__return_storage_ptr__,
               (__return_storage_ptr__->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)
               ._M_impl.super__Vector_impl_data._M_finish,
               (extra_args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (extra_args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
               super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<value> build_args(const std::vector<value>& extra_args) const {
        if (!bound_args_) {
            return extra_args;
        }
        std::vector<value> res;
        auto& ba = bound_args_.dereference(heap_);
        for (uint32_t i = 0; i < ba.length(); ++i) {
            res.push_back(ba[i].get_value(heap_));
        }
        res.insert(res.end(), extra_args.begin(), extra_args.end());
        return res;
    }